

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O2

Query * reorder_subqueries(Query *__return_storage_ptr__,Query *q)

{
  __normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_> __first;
  QueryType *pQVar1;
  vector<Query,_std::allocator<Query>_> *pvVar2;
  
  pQVar1 = Query::get_type(q);
  if (*pQVar1 == AND) {
    pvVar2 = Query::as_queries(q);
    __first._M_current =
         (pvVar2->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data
         ._M_start;
    pvVar2 = Query::as_queries(q);
    std::
    __stable_sort<__gnu_cxx::__normal_iterator<Query*,std::vector<Query,std::allocator<Query>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Query_const&,Query_const&)>>
              (__first,(pvVar2->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
                       super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<bool_(*)(const_Query_&,_const_Query_&)>)0x165e0b);
  }
  Query::Query(__return_storage_ptr__,q);
  return __return_storage_ptr__;
}

Assistant:

Query reorder_subqueries(Query &&q) {
    if (q.get_type() == QueryType::AND) {
        std::stable_sort(q.as_queries().begin(), q.as_queries().end(),
                         query_heuristic_comparer);
    }
    return std::move(q);  // Currently only support AND operators.
}